

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double *pdVar1;
  int *piVar2;
  char *__s1;
  char *data_file;
  pointer pdVar3;
  pointer pvVar4;
  int iVar5;
  int iVar6;
  clock_t cVar7;
  ulong uVar8;
  FILE *pFVar9;
  ulong uVar10;
  clock_t cVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char **ppcVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int true_y;
  ulong unaff_R13;
  bool bVar21;
  uint uVar22;
  double dVar23;
  
  __s1 = argv[1];
  ts_len = atoi(argv[2]);
  data_file = argv[3];
  data_n = atoi(argv[4]);
  alpha = atof(argv[5]);
  readfile(data_file);
  cVar7 = clock();
  iVar6 = strcmp(__s1,"train");
  if (iVar6 == 0) {
    regularization = atof(argv[6]);
    max_iter = atoi(argv[7]);
    learn_rate = atof(argv[8]);
    if (argc == 0xb) {
      test_n = atoi(argv[10]);
      readtestfile(argv[9]);
    }
    init((EVP_PKEY_CTX *)0x0);
    if (0 < max_iter) {
      bVar21 = true;
      uVar10 = 0;
      do {
        iVar6 = (int)uVar10 + (int)(uVar10 / 100) * -100;
        if (iVar6 == 0) {
          printf("epoch %d\n",uVar10);
        }
        if (0 < data_n) {
          lVar20 = 0;
          do {
            if (bVar21) {
              puts("data format:");
              puts("data:");
              if (0 < ts_len) {
                lVar17 = 0;
                do {
                  printf("%9.6f",data_x.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar17]);
                  lVar17 = lVar17 + 1;
                } while (lVar17 < ts_len);
              }
              putchar(10);
              puts("label:");
              if (0 < num_c) {
                lVar17 = 0;
                do {
                  printf("%9.0f",data_y.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar17]);
                  lVar17 = lVar17 + 1;
                } while (lVar17 < num_c);
              }
              putchar(10);
            }
            train(data_x.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar20,
                  data_y.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar20,regularization);
            lVar20 = lVar20 + 1;
            bVar21 = false;
          } while (lVar20 < data_n);
        }
        if (rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&rightlog,
                     (iterator)
                     rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&right_cnt);
        }
        else {
          *rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = right_cnt;
          rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar18 = test_n;
        right_cnt = 0;
        if (iVar6 == 0 && argc == 0xb) {
          if (test_n < 1) {
            uVar16 = 0;
          }
          else {
            lVar20 = 0;
            uVar8 = (ulong)(uint)num_c;
            uVar16 = 0;
            do {
              pvVar4 = test_y.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (0 < (int)uVar8) {
                pdVar3 = test_y.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar20].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar13 = 0;
                do {
                  if (0.0 < pdVar3[uVar13]) {
                    unaff_R13 = uVar13;
                  }
                  unaff_R13 = unaff_R13 & 0xffffffff;
                  pdVar3[uVar13] = 0.0;
                  uVar13 = uVar13 + 1;
                } while ((uVar8 & 0xffffffff) != uVar13);
              }
              predict(test_x.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar20,pvVar4 + lVar20);
              uVar8 = (ulong)num_c;
              iVar6 = 0;
              if (1 < (long)uVar8) {
                pdVar3 = test_y.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar20].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar14 = 1;
                uVar13 = 0;
                do {
                  dVar23 = pdVar3[uVar14];
                  pdVar1 = pdVar3 + (int)uVar13;
                  uVar19 = uVar14 & 0xffffffff;
                  if (dVar23 < *pdVar1 || dVar23 == *pdVar1) {
                    uVar19 = uVar13;
                  }
                  uVar14 = uVar14 + 1;
                  iVar6 = (int)uVar19;
                  uVar13 = uVar19;
                } while (uVar8 != uVar14);
              }
              if (0 < num_c) {
                uVar13 = 0;
                do {
                  dVar23 = 1.0;
                  if ((unaff_R13 & 0xffffffff) != uVar13) {
                    dVar23 = 0.0;
                  }
                  test_y.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar20].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13] = dVar23;
                  uVar13 = uVar13 + 1;
                } while (uVar8 != uVar13);
              }
              uVar16 = (ulong)((int)uVar16 + (uint)((int)unaff_R13 != iVar6));
              lVar20 = lVar20 + 1;
            } while (lVar20 < test_n);
          }
          uVar22 = iVar18 - (int)uVar16;
          printf("Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
                 ((double)(int)uVar22 * 100.0) / (double)iVar18,(ulong)uVar22,uVar16);
        }
        uVar22 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar22;
      } while ((int)uVar22 < max_iter);
    }
    pFVar9 = fopen("rightlog","w");
    if (0 < max_iter) {
      uVar10 = 0;
      do {
        piVar2 = rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar10;
        uVar10 = uVar10 + 1;
        fprintf(pFVar9,"epoch %d accuracy %f\n",(double)*piVar2 / (double)data_n,uVar10 & 0xffffffff
               );
      } while ((long)uVar10 < (long)max_iter);
    }
    fclose(pFVar9);
    save();
  }
  else {
    iVar6 = strcmp(__s1,"test");
    if (iVar6 == 0) {
      init((EVP_PKEY_CTX *)0x1);
      iVar6 = data_n;
      pFVar9 = fopen("result.txt","a");
      if (data_n < 1) {
        uVar22 = 0;
      }
      else {
        uVar10 = (ulong)(uint)num_c;
        lVar20 = 0;
        uVar22 = 0;
        do {
          pvVar4 = data_y.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)uVar10) {
            pdVar3 = data_y.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar20].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            ppcVar15 = (char **)0x0;
            do {
              if (0.0 < pdVar3[(long)ppcVar15]) {
                argv = ppcVar15;
              }
              argv = (char **)((ulong)argv & 0xffffffff);
              pdVar3[(long)ppcVar15] = 0.0;
              ppcVar15 = (char **)((long)ppcVar15 + 1);
            } while ((char **)(uVar10 & 0xffffffff) != ppcVar15);
          }
          predict(data_x.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar20,pvVar4 + lVar20);
          uVar10 = (ulong)num_c;
          iVar18 = 0;
          if (1 < (long)uVar10) {
            pdVar3 = data_y.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar20].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar18 = 0;
            uVar16 = 1;
            do {
              dVar23 = pdVar3[uVar16];
              pdVar1 = pdVar3 + iVar18;
              iVar5 = (int)uVar16;
              if (dVar23 < *pdVar1 || dVar23 == *pdVar1) {
                iVar5 = iVar18;
              }
              iVar18 = iVar5;
              uVar16 = uVar16 + 1;
            } while (uVar10 != uVar16);
          }
          if ((int)argv != iVar18) {
            uVar22 = uVar22 + 1;
            fprintf(pFVar9,"%d case true label %d predict label %d\n",lVar20 + 1U & 0xffffffff,
                    (ulong)argv & 0xffffffff);
            uVar10 = (ulong)(uint)num_c;
            if (0 < num_c) {
              uVar16 = 0;
              do {
                fprintf(pFVar9,"%9.6f",
                        data_y.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar20].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16]);
                iVar18 = 0x2c;
                if (uVar16 == num_c - 1) {
                  iVar18 = 10;
                }
                fputc(iVar18,pFVar9);
                uVar16 = uVar16 + 1;
                uVar10 = (ulong)num_c;
              } while ((long)uVar16 < (long)uVar10);
            }
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < data_n);
      }
      uVar12 = iVar6 - uVar22;
      fprintf(pFVar9,"Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
              ((double)(int)uVar12 * 100.0) / (double)iVar6,(ulong)uVar12,(ulong)uVar22);
      fclose(pFVar9);
    }
    else {
      puts("wrong operation !");
    }
  }
  cVar11 = clock();
  printf("Total Running Time = %.3f sec\n",((double)cVar11 - (double)cVar7) / 1000000.0);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    /**
     * arguments:
     * 1.train ts_len data_file data_n alpha regular max_iter learn_rate [test_data_file test_n]
     * 2.test ts_len data_file data_n alpha
     */
    char *operation = argv[1];
    ts_len = atoi(argv[2]);

    char *data_file = argv[3];
    data_n = atoi(argv[4]);

    alpha = atof(argv[5]);

    readfile(data_file);

    double start_time = clock();

    if (strcmp(operation, "train") == 0) {

        regularization = atof(argv[6]);
        max_iter = atoi(argv[7]);
        learn_rate = atof(argv[8]);

        if (argc == 11) {
            test_n = atoi(argv[10]);
            readtestfile(argv[9]);
        }

        init(0);

        // training
        bool first = true;
        for (int epoch = 0; epoch < max_iter; ++epoch) {
            if (epoch % 100 == 0)
                printf("epoch %d\n", epoch);
            for (int i = 0; i < data_n; ++i) {
                if (first) {
                    printf("data format:\n");
                    printf("data:\n");
                    for (int j = 0; j < ts_len; ++j) {
                        printf("%9.6f", data_x[i][j]);
                    }
                    printf("\n");
                    printf("label:\n");
                    for (int j = 0; j < num_c; ++j) {
                        printf("%9.0f", data_y[i][j]);
                    }
                    printf("\n");
                    first = false;
                }
                train(data_x[i], data_y[i], regularization);
            }

            if (PRINT_LOG) {
                rightlog.push_back(right_cnt);
//                printf("epoch %d accuracy %f\n", epoch, 1.0 * right_cnt / data_n);
                right_cnt = 0;

                if (argc == 11 && epoch % 100 == 0) {
                    int total_case = test_n;
                    int total_wrong = 0;

                    //testing
                    for (int i = 0; i < test_n; ++i) {

                        int true_y, pred_y = 0;
                        for (int j = 0; j < num_c; j++) {
                            if (test_y[i][j] > 0) {
                                true_y = j;
                            }
                            test_y[i][j] = 0; // clear y
                        }

                        predict(test_x[i], test_y[i]);

                        // find the max(y) and its index is the label of the case
                        for (int j = 1; j < num_c; j++) {
                            if (test_y[i][j] > test_y[i][pred_y]) {
                                pred_y = j;
                            }
                        }

                        if (true_y != pred_y) {
                            ++total_wrong;
                        }

                        // reset y
                        for (int j = 0; j < num_c; j++) {
                            test_y[i][j] = 0.0;
                            if (j == true_y) {
                                test_y[i][j] = 1.0;
                            }
                        }

                    }

                    printf("Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
                           100.0 * (total_case - total_wrong) / total_case, total_case - total_wrong, total_wrong);
                }

            }

        }

        if (PRINT_LOG) {
            FILE *flog;
            flog = fopen("rightlog", "w");
            for (int i = 0; i < max_iter; ++i) {
                fprintf(flog, "epoch %d accuracy %f\n", i + 1, 1.0 * rightlog[i] / data_n);
            }
            fclose(flog);
        }

        // output w, w0 and shapelet
        save();

    } else if (strcmp(operation, "test") == 0) {

        // input w, w0 and shapelet
        init(1);

        int total_case = data_n;
        int total_wrong = 0;
        FILE *f = fopen("result.txt", "a");

        //testing
        for (int i = 0; i < data_n; ++i) {

            int true_y, pred_y = 0;
            for (int j = 0; j < num_c; j++) {
                if (data_y[i][j] > 0) {
                    true_y = j;
                }
                data_y[i][j] = 0; // clear y
            }

            predict(data_x[i], data_y[i]);
            // find the max(y) and its index is the label of the case
            for (int j = 1; j < num_c; j++) {
                if (data_y[i][j] > data_y[i][pred_y]) {
                    pred_y = j;
                }
            }

            // a wrong case found
            if (true_y != pred_y) {
                ++total_wrong;
                fprintf(f, "%d case true label %d predict label %d\n", i + 1, true_y, pred_y);
                for (int j = 0; j < num_c; ++j) {
                    fprintf(f, "%9.6f", data_y[i][j]);
                    if (j != num_c - 1) {
                        fprintf(f, ",");
                    } else {
                        fprintf(f, "\n");
                    }
                }
            }

        }

        fprintf(f, "Accuracy = %8.3f Correct = %5d , Wrong = %5d\n", 100.0 * (total_case - total_wrong) / total_case,
                total_case - total_wrong, total_wrong);
        fclose(f);

    } else {
        printf("wrong operation !\n");
    }

    double end_time = clock();
    printf("Total Running Time = %.3f sec\n", (end_time - start_time) / CLOCKS_PER_SEC);

    return 0;
}